

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantmatrix.cc
# Opt level: O0

void __thiscall fasttext::QuantMatrix::load(QuantMatrix *this,istream *in)

{
  uchar *puVar1;
  istream *in_00;
  ProductQuantizer *in_RSI;
  long in_RDI;
  pointer in_stack_ffffffffffffff18;
  unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
  *in_stack_ffffffffffffff20;
  unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_> *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff28;
  ProductQuantizer *in_stack_ffffffffffffff30;
  istream *in_stack_ffffffffffffff38;
  ProductQuantizer *in_stack_ffffffffffffff40;
  ProductQuantizer *pPVar2;
  unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
  local_60 [10];
  ProductQuantizer *local_10;
  
  local_10 = in_RSI;
  std::istream::read((char *)in_RSI,in_RDI + 0x58);
  std::istream::read((char *)local_10,in_RDI + 8);
  std::istream::read((char *)local_10,in_RDI + 0x10);
  std::istream::read((char *)local_10,in_RDI + 0x5c);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1c1da0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff40,
             (size_type)in_stack_ffffffffffffff38,(allocator_type *)in_stack_ffffffffffffff30);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff30);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1c1df0);
  pPVar2 = local_10;
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1c1e07);
  std::istream::read((char *)pPVar2,(long)puVar1);
  operator_new(0x50);
  ProductQuantizer::ProductQuantizer(in_stack_ffffffffffffff30);
  std::unique_ptr<fasttext::ProductQuantizer,std::default_delete<fasttext::ProductQuantizer>>::
  unique_ptr<std::default_delete<fasttext::ProductQuantizer>,void>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
  operator=(in_stack_ffffffffffffff20,
            (unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
             *)in_stack_ffffffffffffff18);
  std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
  ~unique_ptr(in_stack_ffffffffffffff20);
  std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
  operator->((unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
              *)0x1c1e7c);
  ProductQuantizer::load(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if ((*(byte *)(in_RDI + 0x58) & 1) != 0) {
    pPVar2 = *(ProductQuantizer **)(in_RDI + 8);
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1c1ebb);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pPVar2,
               (size_type)in_stack_ffffffffffffff38,(allocator_type *)in_stack_ffffffffffffff30);
    this_00 = local_60;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff30,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x40));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff30);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1c1f0b);
    puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1c1f22);
    std::istream::read((char *)local_10,(long)puVar1);
    in_00 = (istream *)operator_new(0x50);
    ProductQuantizer::ProductQuantizer(local_10);
    std::unique_ptr<fasttext::ProductQuantizer,std::default_delete<fasttext::ProductQuantizer>>::
    unique_ptr<std::default_delete<fasttext::ProductQuantizer>,void>
              (this_00,in_stack_ffffffffffffff18);
    std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
    operator=(this_00,(unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                       *)in_stack_ffffffffffffff18);
    std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
    ~unique_ptr(this_00);
    std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
    operator->((unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                *)0x1c1f8e);
    ProductQuantizer::load(pPVar2,in_00);
  }
  return;
}

Assistant:

void QuantMatrix::load(std::istream& in) {
  in.read((char*)&qnorm_, sizeof(qnorm_));
  in.read((char*)&m_, sizeof(m_));
  in.read((char*)&n_, sizeof(n_));
  in.read((char*)&codesize_, sizeof(codesize_));
  codes_ = std::vector<uint8_t>(codesize_);
  in.read((char*)codes_.data(), codesize_ * sizeof(uint8_t));
  pq_ = std::unique_ptr<ProductQuantizer>(new ProductQuantizer());
  pq_->load(in);
  if (qnorm_) {
    norm_codes_ = std::vector<uint8_t>(m_);
    in.read((char*)norm_codes_.data(), m_ * sizeof(uint8_t));
    npq_ = std::unique_ptr<ProductQuantizer>(new ProductQuantizer());
    npq_->load(in);
  }
}